

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cute_runner.h
# Opt level: O0

bool __thiscall cute::runner_aux::prefixMatcher::operator()(prefixMatcher *this,string *s)

{
  long lVar1;
  long lVar2;
  char *pcVar3;
  undefined1 local_31;
  undefined1 local_21;
  size_t found;
  string *s_local;
  prefixMatcher *this_local;
  
  lVar1 = std::__cxx11::string::find((string *)s,(ulong)this);
  local_21 = false;
  if (lVar1 == 0) {
    lVar1 = std::__cxx11::string::size();
    lVar2 = std::__cxx11::string::size();
    local_31 = true;
    if (lVar1 != lVar2) {
      std::__cxx11::string::size();
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s);
      local_31 = *pcVar3 == '#';
    }
    local_21 = local_31;
  }
  return local_21;
}

Assistant:

bool operator()(std::string const &s) const {
			size_t found=s.find(prefix);
			return found==0 && (s.size()==prefix.size() || s[prefix.size()]=='#');
		}